

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

int default_stream_scheduler_can_send
              (quicly_stream_scheduler_t *self,quicly_conn_t *conn,int conn_is_saturated)

{
  int iVar1;
  quicly_linklist_t *prev;
  int in_EDX;
  long in_RSI;
  st_quicly_default_scheduler_state_t *sched;
  quicly_linklist_t *in_stack_ffffffffffffffd8;
  
  prev = (quicly_linklist_t *)(in_RSI + 800);
  if (in_EDX == 0) {
    quicly_linklist_insert_list(prev,in_stack_ffffffffffffffd8);
  }
  iVar1 = quicly_linklist_is_linked(prev);
  return iVar1;
}

Assistant:

static int default_stream_scheduler_can_send(quicly_stream_scheduler_t *self, quicly_conn_t *conn, int conn_is_saturated)
{
    struct st_quicly_default_scheduler_state_t *sched = &((struct _st_quicly_conn_public_t *)conn)->_default_scheduler;

    if (!conn_is_saturated) {
        /* not saturated */
        quicly_linklist_insert_list(&sched->active, &sched->blocked);
    } else {
        /* The code below is disabled, because H2O's scheduler doesn't allow you to "walk" the priority tree without actually
         * running the round robin, and we want quicly's default to behave like H2O so that we can catch errors.  The downside is
         * that there'd be at most one spurious call of `quicly_send` when the connection is saturated, but that should be fine.
         */
        if (0) {
            /* Saturated. Lazily move such streams to the "blocked" list, at the same time checking if anything can be sent. */
            while (quicly_linklist_is_linked(&sched->active)) {
                quicly_stream_t *stream =
                    (void *)((char *)sched->active.next - offsetof(quicly_stream_t, _send_aux.pending_link.default_scheduler));
                if (quicly_stream_can_send(stream, 0))
                    return 1;
                quicly_linklist_unlink(&stream->_send_aux.pending_link.default_scheduler);
                quicly_linklist_insert(sched->blocked.prev, &stream->_send_aux.pending_link.default_scheduler);
            }
        }
    }

    return quicly_linklist_is_linked(&sched->active);
}